

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O3

Material *
json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *c)

{
  function<Vector2f_(Vector2f)> *__x;
  bool bVar1;
  const_iterator cVar2;
  mapped_type *ppMVar3;
  ostream *poVar4;
  const_reference pvVar5;
  BRDFMaterial *this;
  string d;
  float ret_1;
  float ret;
  string_t local_170;
  Texture local_150;
  Texture local_e8;
  Texture local_80;
  
  if (json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
      ::mat_map_abi_cxx11_ == '\0') {
    json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ();
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_170,c,-1,' ',false,strict);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
          ::find(&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                  ::mat_map_abi_cxx11_._M_t,&local_170);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
       ::mat_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"new mat: ",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_170._M_dataplus._M_p,local_170._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)c,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar5,"BRDFMaterial");
    if (bVar1) {
      this = (BRDFMaterial *)operator_new(0x148);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)c,"dc");
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (&local_150,pvVar5);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)c,"sc");
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (&local_e8,pvVar5);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)c,"r");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                (pvVar5,(float *)&local_80);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)c,"ec");
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (&local_80,pvVar5);
      BRDFMaterial::BRDFMaterial(this,&local_150,&local_e8,(float)local_80.type,&local_80);
      ppMVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                ::operator[](&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                              ::mat_map_abi_cxx11_,&local_170);
      *ppMVar3 = (mapped_type)this;
      if (local_80.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_80.scale.super__Function_base._M_manager)
                  ((_Any_data *)&local_80.scale,(_Any_data *)&local_80.scale,__destroy_functor);
      }
      if (local_e8.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.scale.super__Function_base._M_manager)
                  ((_Any_data *)&local_e8.scale,(_Any_data *)&local_e8.scale,__destroy_functor);
      }
      if (local_150.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_150.scale.super__Function_base._M_manager)
                  ((_Any_data *)&local_150.scale,(_Any_data *)&local_150.scale,__destroy_functor);
      }
    }
    else {
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)c,"type");
      bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar5,"SolidGlassMaterial");
      if (bVar1) {
        this = (BRDFMaterial *)operator_new(0xe0);
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)c,"n");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                  (pvVar5,(float *)&local_150);
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)c,"reflectc");
        json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (&local_150,pvVar5);
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)c,"refractc");
        json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (&local_e8,pvVar5);
        SolidGlassMaterial::SolidGlassMaterial
                  ((SolidGlassMaterial *)this,(float)local_150.type,&local_150,&local_e8);
        ppMVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                  ::operator[](&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                                ::mat_map_abi_cxx11_,&local_170);
        *ppMVar3 = (mapped_type)this;
        if (local_e8.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_e8.scale.super__Function_base._M_manager)
                    ((_Any_data *)&local_e8.scale,(_Any_data *)&local_e8.scale,__destroy_functor);
        }
        if (local_150.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_150.scale.super__Function_base._M_manager)
                    ((_Any_data *)&local_150.scale,(_Any_data *)&local_150.scale,__destroy_functor);
        }
      }
      else {
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)c,"type");
        bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar5,"GlassMaterial");
        if (bVar1) {
          this = (BRDFMaterial *)operator_new(0xf0);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"n");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                    (pvVar5,(float *)&local_150);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"reflectc");
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (&local_150,pvVar5);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"refractc");
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (&local_e8,pvVar5);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"t");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                    (pvVar5,(float *)&local_80);
          GlassMaterial::GlassMaterial
                    ((GlassMaterial *)this,(float)local_150.type,&local_150,&local_e8,
                     (float)local_80.type);
          ppMVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                    ::operator[](&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                                  ::mat_map_abi_cxx11_,&local_170);
          *ppMVar3 = (mapped_type)this;
          if (local_e8.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_e8.scale.super__Function_base._M_manager)
                      ((_Any_data *)&local_e8.scale,(_Any_data *)&local_e8.scale,__destroy_functor);
          }
          if (local_150.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_150.scale.super__Function_base._M_manager)
                      ((_Any_data *)&local_150.scale,(_Any_data *)&local_150.scale,__destroy_functor
                      );
          }
        }
        else {
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"type");
          bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar5,"MirrorMaterial");
          if (!bVar1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/sceneloader.h"
                          ,0x67,
                          "Material *json_parse_material(const T &) [T = nlohmann::basic_json<>]");
          }
          this = (BRDFMaterial *)operator_new(0x70);
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)c,"c");
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (&local_150,pvVar5);
          (this->super_Material)._vptr_Material = (_func_int **)&PTR_shade_001f69e8;
          *(ulong *)&this->diffuseColor = CONCAT44(local_150._4_4_,local_150.type);
          (this->diffuseColor).source = local_150.source;
          Vector3f::Vector3f(&(this->diffuseColor).color,&local_150.color);
          __x = &local_150.scale;
          std::function<Vector2f_(Vector2f)>::function(&(this->diffuseColor).scale,__x);
          (this->diffuseColor).empty = local_150.empty;
          (this->diffuseColor).image_w = local_150.image_w;
          (this->diffuseColor).image_h = local_150.image_h;
          (this->diffuseColor).image_c = local_150.image_c;
          *(undefined4 *)&(this->diffuseColor).field_0x4c = local_150._76_4_;
          (this->diffuseColor).image_buff_stbi = local_150.image_buff_stbi;
          (this->diffuseColor).hdr_buff = local_150.hdr_buff;
          ppMVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                    ::operator[](&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                                  ::mat_map_abi_cxx11_,&local_170);
          *ppMVar3 = (mapped_type)this;
          if (local_150.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_150.scale.super__Function_base._M_manager)
                      ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
          }
        }
      }
    }
  }
  else {
    ppMVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
              ::operator[](&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                            ::mat_map_abi_cxx11_,&local_170);
    this = (BRDFMaterial *)*ppMVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return &this->super_Material;
}

Assistant:

Material* json_parse_material(const T& c)
{
	static std::map<std::string, Material*> mat_map;
	std::string d = c.dump();
	if (mat_map.count(d)) return mat_map[d];
	std::cerr << "new mat: " << d << std::endl;
	if(c["type"]=="BRDFMaterial") {
		return mat_map[d] = new BRDFMaterial(json_to_texture(c["dc"]), json_to_texture(c["sc"]), c["r"], json_to_texture(c["ec"]));
	}
	else if (c["type"] == "SolidGlassMaterial") {
		return mat_map[d] = new SolidGlassMaterial(float(c["n"]), json_to_texture(c["reflectc"]), json_to_texture(c["refractc"]));
	}
	else if (c["type"] == "GlassMaterial") {
		return mat_map[d] = new GlassMaterial(float(c["n"]), json_to_texture(c["reflectc"]), json_to_texture(c["refractc"]), float(c["t"]));
	}
	else if (c["type"] == "MirrorMaterial") {
		return mat_map[d] = new MirrorMaterial(json_to_texture(c["c"]));
	}
	else assert(0);
}